

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::ReplacementVisitor::visit(ReplacementVisitor *this,DirectionalAtom *datom)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ostream *poVar4;
  double *pdVar5;
  Atom *atom;
  element_type *peVar6;
  element_type *this_00;
  shared_ptr<OpenMD::GenericData> *in_RSI;
  BaseAtomVisitor *this_01;
  iterator iter;
  shared_ptr<OpenMD::AtomInfo> siteInfo;
  Mat3x3d mat;
  bool haveAtomData;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  Vector3d newVec;
  Mat3x3d skewMat;
  Vector3d j;
  Vector3d trq;
  Vector3d frc;
  Vector3d vel;
  Vector3d pos;
  Mat3x3d I;
  RotMat3x3d Atrans;
  RotMat3x3d A;
  string *in_stack_fffffffffffff8f8;
  AtomData *in_stack_fffffffffffff900;
  StuntDouble *in_stack_fffffffffffff908;
  shared_ptr<OpenMD::GenericData> *in_stack_fffffffffffff918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff920;
  element_type *in_stack_fffffffffffff928;
  StuntDouble *in_stack_fffffffffffff930;
  SquareMatrix3<double> *in_stack_fffffffffffff938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff940;
  allocator<char> local_559;
  string local_558 [48];
  undefined1 local_528 [168];
  __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
  local_480;
  __shared_ptr local_478 [304];
  undefined1 local_348 [176];
  string local_298 [55];
  allocator<char> local_261;
  string local_260 [52];
  undefined4 local_22c;
  string local_228 [39];
  bool local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  RectMatrix<double,_3U,_3U> local_1b8;
  Vector<double,_3U> local_170 [5];
  RectMatrix<double,_3U,_3U> local_f8 [3];
  shared_ptr<OpenMD::GenericData> *local_10;
  
  local_10 = in_RSI;
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x350664);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x350671);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x350680);
  Vector3<double>::Vector3((Vector3<double> *)0x35068f);
  Vector3<double>::Vector3((Vector3<double> *)0x35069e);
  Vector3<double>::Vector3((Vector3<double> *)0x3506ad);
  Vector3<double>::Vector3((Vector3<double> *)0x3506bc);
  Vector3<double>::Vector3((Vector3<double> *)0x3506cb);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3506da);
  Vector3<double>::Vector3((Vector3<double> *)0x3506e9);
  std::shared_ptr<OpenMD::AtomInfo>::shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x3506f8);
  std::shared_ptr<OpenMD::AtomData>::shared_ptr((shared_ptr<OpenMD::AtomData> *)0x350705);
  std::shared_ptr<OpenMD::GenericData>::shared_ptr((shared_ptr<OpenMD::GenericData> *)0x350712);
  (*(code *)(local_10->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            [1].id_._M_string_length)(local_228);
  bVar3 = isReplacedAtom((ReplacementVisitor *)in_stack_fffffffffffff930,
                         (string *)in_stack_fffffffffffff928);
  std::__cxx11::string::~string(local_228);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,
               (allocator<char> *)in_stack_fffffffffffff930);
    StuntDouble::getPropertyByName(in_stack_fffffffffffff908,(string *)in_stack_fffffffffffff900);
    std::shared_ptr<OpenMD::GenericData>::operator=
              ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffff900,
               (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffff8f8);
    std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x3508af);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator(&local_261);
    bVar3 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffff900,
                            in_stack_fffffffffffff8f8);
    if (bVar3) {
      std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>(in_stack_fffffffffffff918);
      std::shared_ptr<OpenMD::AtomData>::operator=
                ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffff900,
                 (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffff8f8);
      std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x35091a);
      local_201 = std::operator==((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffff900,
                                  in_stack_fffffffffffff8f8);
      if (local_201) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"can not get Atom Data from ");
        (*(code *)(local_10->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr[1].id_._M_string_length)(local_298);
        poVar4 = std::operator<<(poVar4,local_298);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_298);
        std::make_shared<OpenMD::AtomData>();
        std::shared_ptr<OpenMD::AtomData>::operator=
                  ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffff900,
                   (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffff8f8);
        std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x3509df);
      }
      local_201 = !local_201;
    }
    else {
      std::make_shared<OpenMD::AtomData>();
      std::shared_ptr<OpenMD::AtomData>::operator=
                ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffff900,
                 (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffff8f8);
      std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x350a93);
      local_201 = false;
    }
    StuntDouble::getPos(in_stack_fffffffffffff908);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffff900,
               (Vector3<double> *)in_stack_fffffffffffff8f8);
    StuntDouble::getVel(in_stack_fffffffffffff908);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffff900,
               (Vector3<double> *)in_stack_fffffffffffff8f8);
    StuntDouble::getJ(in_stack_fffffffffffff908);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffff900,
               (Vector3<double> *)in_stack_fffffffffffff8f8);
    (*(code *)(local_10->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              [1]._vptr_GenericData)(local_348);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffff900,
               (SquareMatrix3<double> *)in_stack_fffffffffffff8f8);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x350b64);
    StuntDouble::getA(in_stack_fffffffffffff908);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffff900,
               (SquareMatrix3<double> *)in_stack_fffffffffffff8f8);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x350b9f);
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(&local_1b8,0,0);
    *pdVar5 = 0.0;
    pdVar5 = Vector<double,_3U>::operator[](local_170,2);
    dVar1 = *pdVar5;
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(local_f8,2,2);
    dVar2 = *pdVar5;
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(&local_1b8,0,1);
    *pdVar5 = dVar1 / dVar2;
    pdVar5 = Vector<double,_3U>::operator[](local_170,1);
    dVar1 = *pdVar5;
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(local_f8,1,1);
    dVar2 = *pdVar5;
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(&local_1b8,0,2);
    *pdVar5 = -dVar1 / dVar2;
    pdVar5 = Vector<double,_3U>::operator[](local_170,2);
    dVar1 = *pdVar5;
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(local_f8,2,2);
    this_01 = (BaseAtomVisitor *)(-dVar1 / *pdVar5);
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(&local_1b8,1,0);
    *pdVar5 = (double)this_01;
    atom = (Atom *)RectMatrix<double,_3U,_3U>::operator()(&local_1b8,1,1);
    (atom->super_StuntDouble)._vptr_StuntDouble = (_func_int **)0x0;
    pdVar5 = Vector<double,_3U>::operator[](local_170,0);
    dVar1 = *pdVar5;
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(local_f8,0,0);
    dVar2 = *pdVar5;
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(&local_1b8,1,2);
    *pdVar5 = dVar1 / dVar2;
    pdVar5 = Vector<double,_3U>::operator[](local_170,1);
    dVar1 = *pdVar5;
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(local_f8,1,1);
    dVar2 = *pdVar5;
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(&local_1b8,2,0);
    *pdVar5 = dVar1 / dVar2;
    pdVar5 = Vector<double,_3U>::operator[](local_170,0);
    dVar1 = *pdVar5;
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(local_f8,0,0);
    dVar2 = *pdVar5;
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(&local_1b8,2,1);
    *pdVar5 = -dVar1 / dVar2;
    pdVar5 = RectMatrix<double,_3U,_3U>::operator()(&local_1b8,2,2);
    *pdVar5 = 0.0;
    OpenMD::operator*(in_stack_fffffffffffff938,(SquareMatrix3<double> *)in_stack_fffffffffffff930);
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_fffffffffffff928);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x351041);
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_fffffffffffff928);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffff900,
               (SquareMatrix3<double> *)in_stack_fffffffffffff8f8);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x35107c);
    std::shared_ptr<OpenMD::AtomInfo>::shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x351089);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
    ::__normal_iterator(&local_480);
    std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3510ac);
    AtomData::beginAtomInfo(in_stack_fffffffffffff928,(iterator *)in_stack_fffffffffffff920);
    std::shared_ptr<OpenMD::AtomInfo>::operator=
              ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff900,
               (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff8f8);
    std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x3510e5);
    while (bVar3 = std::__shared_ptr::operator_cast_to_bool(local_478), bVar3) {
      std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x351108);
      OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff928,
                        (Vector<double,_3U> *)in_stack_fffffffffffff920);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff908,
                 (Vector<double,_3U> *)in_stack_fffffffffffff900);
      std::make_shared<OpenMD::AtomInfo>();
      in_stack_fffffffffffff940 = &local_1e0;
      in_stack_fffffffffffff938 = (SquareMatrix3<double> *)(local_528 + 0x70);
      std::shared_ptr<OpenMD::AtomInfo>::operator=
                ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff900,
                 (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff8f8);
      std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x351175);
      peVar6 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x351182);
      this_00 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x351191);
      std::__cxx11::string::operator=((string *)this_00,(string *)peVar6);
      OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff908,
                        (Vector<double,_3U> *)in_stack_fffffffffffff900);
      std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x3511cc);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff908,
                 (Vector<double,_3U> *)in_stack_fffffffffffff900);
      peVar6 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3511ef);
      if ((peVar6->hasVector & 1U) == 0) {
        std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x35133d);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff900,
                   (Vector3<double> *)in_stack_fffffffffffff8f8);
      }
      else {
        std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x351209);
        OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff928,
                          (Vector<double,_3U> *)in_stack_fffffffffffff920);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff908,
                   (Vector<double,_3U> *)in_stack_fffffffffffff900);
        std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x35124b);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff900,
                   (Vector3<double> *)in_stack_fffffffffffff8f8);
      }
      std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x351361);
      OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff928,
                        (Vector<double,_3U> *)in_stack_fffffffffffff920);
      OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff908,
                        (Vector<double,_3U> *)in_stack_fffffffffffff900);
      std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x3513ab);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff908,
                 (Vector<double,_3U> *)in_stack_fffffffffffff900);
      in_stack_fffffffffffff920 = &local_1e0;
      peVar6 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3513d3);
      peVar6->hasVelocity = true;
      in_stack_fffffffffffff928 =
           std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x3513e7);
      in_stack_fffffffffffff930 = (StuntDouble *)local_528;
      std::shared_ptr<OpenMD::AtomInfo>::shared_ptr
                ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff900,
                 (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff8f8);
      AtomData::addAtomInfo
                (in_stack_fffffffffffff900,(shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff8f8
                );
      std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x351421);
      std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x351432);
      AtomData::nextAtomInfo(in_stack_fffffffffffff928,(iterator *)in_stack_fffffffffffff920);
      std::shared_ptr<OpenMD::AtomInfo>::operator=
                ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff900,
                 (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffff8f8);
      std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x35146e);
    }
    if ((local_201 & 1U) == 0) {
      std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x3514b4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,
                 (allocator<char> *)in_stack_fffffffffffff930);
      GenericData::setID(&in_stack_fffffffffffff900->super_GenericData,in_stack_fffffffffffff8f8);
      std::__cxx11::string::~string(local_558);
      std::allocator<char>::~allocator(&local_559);
      std::shared_ptr<OpenMD::GenericData>::shared_ptr<OpenMD::AtomData,void>
                (local_10,(shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffff8f8);
      StuntDouble::addProperty
                (in_stack_fffffffffffff930,
                 (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffff928);
      std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x351559)
      ;
    }
    BaseAtomVisitor::setVisited(this_01,atom);
    std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x3515ee);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3515fb);
    local_22c = 0;
  }
  else {
    local_22c = 1;
  }
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x351613);
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x351620);
  std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x35162d);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x35163a);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x351647);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x351654);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x351661);
  return;
}

Assistant:

void ReplacementVisitor::visit(DirectionalAtom* datom) {
    RotMat3x3d A;
    RotMat3x3d Atrans;
    Mat3x3d I;
    Vector3d pos;
    Vector3d vel;
    Vector3d frc;
    Vector3d trq;
    Vector3d j;
    Mat3x3d skewMat;

    Vector3d newVec;
    std::shared_ptr<AtomInfo> atomInfo;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<GenericData> data;
    bool haveAtomData;

    // if atom is not one of our recognized atom types, just skip it
    if (!isReplacedAtom(datom->getType())) return;

    data = datom->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) {
        std::cerr << "can not get Atom Data from " << datom->getType()
                  << std::endl;
        atomData     = std::make_shared<AtomData>();
        haveAtomData = false;
      } else
        haveAtomData = true;
    } else {
      atomData     = std::make_shared<AtomData>();
      haveAtomData = false;
    }

    pos = datom->getPos();
    vel = datom->getVel();

    j = datom->getJ();
    I = datom->getI();
    A = datom->getA();

    skewMat(0, 0) = 0;
    skewMat(0, 1) = j[2] / I(2, 2);
    skewMat(0, 2) = -j[1] / I(1, 1);
    skewMat(1, 0) = -j[2] / I(2, 2);
    skewMat(1, 1) = 0;
    skewMat(1, 2) = j[0] / I(0, 0);
    skewMat(2, 0) = j[1] / I(1, 1);
    skewMat(2, 1) = -j[0] / I(0, 0);
    skewMat(2, 2) = 0;
    Mat3x3d mat   = (A * skewMat).transpose();

    // We need A^T to convert from body-fixed to space-fixed:
    Atrans = A.transpose();

    std::shared_ptr<AtomInfo> siteInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator iter;

    for (siteInfo = sites_->beginAtomInfo(iter); siteInfo;
         siteInfo = sites_->nextAtomInfo(iter)) {
      newVec = Atrans * siteInfo->pos;

      atomInfo               = std::make_shared<AtomInfo>();
      atomInfo->atomTypeName = siteInfo->atomTypeName;
      atomInfo->pos          = pos + newVec;

      if (siteInfo->hasVector) {
        newVec        = Atrans * siteInfo->vec;
        atomInfo->vec = newVec;
      } else {
        atomInfo->vec = V3Zero;
      }

      atomInfo->vel         = vel + mat * siteInfo->pos;
      atomInfo->hasVelocity = true;

      atomData->addAtomInfo(atomInfo);
    }
    if (!haveAtomData) {
      atomData->setID("ATOMDATA");
      datom->addProperty(atomData);
    }

    setVisited(datom);
  }